

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall
amrex::MLMG::getFluxes
          (MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_flux,
          Location a_loc)

{
  bool bVar1;
  vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_RDI;
  Any *s;
  iterator __end1;
  iterator __begin1;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *__range1;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> solmf;
  Location in_stack_0000011c;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_00000120;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_00000128;
  MLMG *in_stack_00000130;
  MultiFab *in_stack_ffffffffffffff88;
  MultiFab *in_stack_ffffffffffffffa8;
  __normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_> local_40;
  vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_38;
  
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x14fb2f6);
  local_38 = in_RDI + 6;
  local_40._M_current =
       (Any *)std::vector<amrex::Any,_std::allocator<amrex::Any>_>::begin
                        ((vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                         in_stack_ffffffffffffff88);
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::end
            ((vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>
                        *)in_RDI,
                       (__normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>::
    operator*(&local_40);
    in_stack_ffffffffffffff88 = Any::get<amrex::MultiFab>((Any *)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffa8 = in_stack_ffffffffffffff88;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
              (in_RDI,(value_type *)in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>::
    operator++(&local_40);
  }
  getFluxes(in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_0000011c);
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x14fb3be);
  return;
}

Assistant:

void
MLMG::getFluxes (const Vector<MultiFab*> & a_flux, Location a_loc)
{
    AMREX_ASSERT(sol.size() == a_flux.size());
    Vector<MultiFab*> solmf;
    for (auto & s : sol) {
        solmf.push_back(&(s.get<MultiFab>()));
    }
    getFluxes(a_flux, solmf, a_loc);
}